

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeMemFreeExtEpilogue
          (ZEbasic_leakChecker *this,ze_context_handle_t param_1,ze_memory_free_ext_desc_t *param_2,
          void *param_3,ze_result_t result)

{
  allocator local_51;
  string local_50 [36];
  ze_result_t local_2c;
  void *pvStack_28;
  ze_result_t result_local;
  void *param_3_local;
  ze_memory_free_ext_desc_t *param_2_local;
  ze_context_handle_t param_1_local;
  ZEbasic_leakChecker *this_local;
  
  local_2c = result;
  if (result == ZE_RESULT_SUCCESS) {
    pvStack_28 = param_3;
    param_3_local = param_2;
    param_2_local = (ze_memory_free_ext_desc_t *)param_1;
    param_1_local = (ze_context_handle_t)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"zeMemFreeExt",&local_51);
    countFunctionCall(this,(string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return local_2c;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeMemFreeExtEpilogue(ze_context_handle_t, const ze_memory_free_ext_desc_t*, void *, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeMemFreeExt");
        }
        return result;
    }